

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void fixjump(FuncState *fs,int pc,int dest)

{
  Instruction *pIVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = ~pc + dest;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  if (uVar3 < 0x20000) {
    pIVar1 = fs->f->code;
    pIVar1[pc] = uVar2 * 0x4000 + (pIVar1[pc] & 0x3fff) + 0x7fffc000;
    return;
  }
  luaX_syntaxerror(fs->ls,"control structure too long");
}

Assistant:

static void fixjump (FuncState *fs, int pc, int dest) {
  Instruction *jmp = &fs->f->code[pc];
  int offset = dest-(pc+1);
  lua_assert(dest != NO_JUMP);
  if (abs(offset) > MAXARG_sBx)
    luaX_syntaxerror(fs->ls, "control structure too long");
  SETARG_sBx(*jmp, offset);
}